

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  Message *message;
  AssertHelper *in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_bucknum;
  HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffea8;
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffeb0;
  HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  AssertHelper *rhs_expression;
  char *in_stack_fffffffffffffec8;
  int iVar2;
  AssertHelper *lhs_expression;
  char *in_stack_fffffffffffffed0;
  Type type;
  AssertionResult local_f8 [2];
  value_type *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar3;
  AssertionResult local_c8 [2];
  key_type local_a8;
  size_type local_a0;
  AssertionResult local_98 [3];
  value_type local_60;
  size_type local_38;
  undefined4 local_2c;
  AssertionResult local_28;
  key_type local_18;
  size_type local_10;
  
  type = (Type)((ulong)(in_RDI + 2) >> 0x20);
  local_18 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  local_10 = google::
             BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffeb0,(key_type *)in_stack_fffffffffffffea8);
  local_2c = 0;
  local_38 = google::
             BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_size(in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,(uint *)in_stack_fffffffffffffeb8,
             (unsigned_long *)in_stack_fffffffffffffeb0);
  iVar2 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    in_stack_fffffffffffffed0 =
         testing::AssertionResult::failure_message((AssertionResult *)0xc9e36c);
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,type,in_stack_fffffffffffffed0,iVar2,in_stack_fffffffffffffec0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (Message *)in_stack_ffffffffffffff28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffeb0);
    testing::Message::~Message((Message *)0xc9e3c9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9e43a);
  rhs_expression = in_RDI + 2;
  local_60 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffea8,0);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
           in_stack_ffffffffffffff28);
  lhs_expression = in_RDI + 2;
  local_a8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  local_a0 = google::
             BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffeb0,(key_type *)in_stack_fffffffffffffea8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)lhs_expression,(char *)rhs_expression,
             (unsigned_long *)in_stack_fffffffffffffeb8,(unsigned_long *)in_stack_fffffffffffffeb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    in_stack_fffffffffffffeb8 =
         (HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xc9e525);
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,type,in_stack_fffffffffffffed0,(int)((ulong)lhs_expression >> 0x20),
               (char *)rhs_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (Message *)in_stack_ffffffffffffff28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffeb0);
    testing::Message::~Message((Message *)0xc9e582);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9e5f0);
  uVar3 = 1;
  message = (Message *)
            google::
            BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_size(in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)lhs_expression,(char *)rhs_expression,(uint *)in_stack_fffffffffffffeb8,
             (unsigned_long *)in_stack_fffffffffffffeb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    in_stack_fffffffffffffeb0 =
         (BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xc9e687);
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,type,in_stack_fffffffffffffed0,(int)((ulong)lhs_expression >> 0x20),
               (char *)rhs_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar3,in_stack_ffffffffffffff30),message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffeb0);
    testing::Message::~Message((Message *)0xc9e6d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9e73d);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_size(in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)lhs_expression,(char *)rhs_expression,(uint *)in_stack_fffffffffffffeb8,
             (unsigned_long *)in_stack_fffffffffffffeb0);
  iVar2 = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::AssertionResult::failure_message((AssertionResult *)0xc9e7c3);
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,type,in_stack_fffffffffffffed0,iVar2,(char *)rhs_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar3,in_stack_ffffffffffffff30),message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffeb0);
    testing::Message::~Message((Message *)0xc9e80f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9e871);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BucketAndBucketSize) {
  const typename TypeParam::size_type expected_bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum));

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(expected_bucknum, this->ht_.bucket(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.bucket_size(expected_bucknum));

  // Check that a bucket we didn't insert into, has a 0 size.  Since
  // we have an even number of buckets, bucknum^1 is guaranteed in range.
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum ^ 1));
}